

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window)

{
  uint uVar1;
  uint uVar2;
  ImGuiPopupRef *pIVar3;
  ImGuiWindow *pIVar4;
  ulong uVar5;
  int m;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = (GImGui->OpenPopupStack).Size;
  uVar5 = (ulong)uVar1;
  if (uVar5 != 0) {
    uVar7 = 0;
    if ((ref_window == (ImGuiWindow *)0x0) || ((int)uVar1 < 1)) {
LAB_0014d50c:
      if ((int)uVar7 < (int)uVar1) {
        ClosePopupToLevel((int)uVar7);
        return;
      }
    }
    else {
      pIVar3 = (GImGui->OpenPopupStack).Data;
      uVar7 = 0;
      do {
        pIVar4 = pIVar3[uVar7].Window;
        if (pIVar4 != (ImGuiWindow *)0x0) {
          uVar2 = pIVar4->Flags;
          if ((uVar2 >> 0x1a & 1) == 0) {
            __assert_fail("(popup.Window->Flags & ImGuiWindowFlags_Popup) != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                          ,0x1336,"void ImGui::ClosePopupsOverWindow(ImGuiWindow *)");
          }
          uVar6 = uVar7;
          if ((uVar2 >> 0x18 & 1) == 0) {
            do {
              while (pIVar4 = pIVar3[uVar6].Window, pIVar4 == (ImGuiWindow *)0x0) {
                uVar6 = uVar6 + 1;
                if (uVar5 <= uVar6) goto LAB_0014d50c;
              }
              pIVar4 = pIVar4->RootWindow;
            } while ((uVar6 + 1 < uVar5) && (uVar6 = uVar6 + 1, pIVar4 != ref_window->RootWindow));
            if (pIVar4 != ref_window->RootWindow) goto LAB_0014d50c;
          }
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar5);
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.empty())
        return;

    // When popups are stacked, clicking on a lower level popups puts focus back to it and close popups above it.
    // Don't close our own child popup windows.
    int n = 0;
    if (ref_window)
    {
        for (n = 0; n < g.OpenPopupStack.Size; n++)
        {
            ImGuiPopupRef& popup = g.OpenPopupStack[n];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack if popups are not direct descendant of the reference window (which is often the NavWindow)
            bool has_focus = false;
            for (int m = n; m < g.OpenPopupStack.Size && !has_focus; m++)
                has_focus = (g.OpenPopupStack[m].Window && g.OpenPopupStack[m].Window->RootWindow == ref_window->RootWindow);
            if (!has_focus)
                break;
        }
    }
    if (n < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the block below
        ClosePopupToLevel(n);
}